

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

bool sb_reserve_next_reusable_blocks(fdb_kvs_handle *handle)

{
  superblock *psVar1;
  uint64_t uVar2;
  ulong uVar3;
  sb_rsv_bmp *psVar4;
  uint8_t *puVar5;
  uint64_t uVar6;
  fdb_kvs_handle *in_RDI;
  stale_header_info sVar7;
  reusable_block_list rVar8;
  sb_rsv_bmp *rsv;
  superblock *sb;
  reusable_block_list blist;
  stale_header_info sheader;
  uint64_t bmp_size_byte;
  uint64_t num_blocks;
  size_t i;
  fdb_kvs_handle *in_stack_00000280;
  stale_header_info in_stack_00000288;
  ulong local_78;
  reusable_block *local_70;
  uint64_t local_68;
  avl_tree *local_60;
  avl_tree *bmp_idx;
  ulong local_18;
  bool local_1;
  
  psVar1 = in_RDI->file->sb;
  if (psVar1->rsv_bmp == (sb_rsv_bmp *)0x0) {
    sVar7 = fdb_get_smallest_active_header(in_RDI);
    local_68 = sVar7.revnum;
    local_60 = (avl_tree *)sVar7.bid;
    if (local_60 == (avl_tree *)0xffffffffffffffff) {
      local_1 = false;
    }
    else {
      uVar6 = local_68;
      bmp_idx = local_60;
      rVar8 = fdb_get_reusable_block(in_stack_00000280,in_stack_00000288);
      local_78 = rVar8.n_blocks;
      local_70 = rVar8.blocks;
      if (local_78 == 0) {
        local_1 = false;
      }
      else {
        uVar2 = filemgr_get_pos((filemgr *)0x18a3ca);
        uVar3 = uVar2 / in_RDI->file->blocksize;
        if (uVar3 != 0) {
          psVar4 = (sb_rsv_bmp *)calloc(1,0x68);
          puVar5 = (uint8_t *)calloc(1,uVar3 + 7 >> 3);
          psVar4->bmp = puVar5;
          psVar4->cur_alloc_bid = 0xffffffffffffffff;
          atomic_init_uint32_t((atomic<unsigned_int> *)local_60,(uint32_t)(local_68 >> 0x20));
          avl_init(&psVar4->bmp_idx,(void *)0x0);
          psVar4->bmp_size = uVar3;
          for (local_18 = 0; local_18 < local_78; local_18 = local_18 + 1) {
            sb_bmp_set((uint8_t *)local_60,local_68,0x18a4bd);
            if ((local_18 == 0) && (psVar4->cur_alloc_bid == 0xffffffffffffffff)) {
              psVar4->cur_alloc_bid = local_70->bid;
            }
            psVar4->num_free_blocks = local_70[local_18].count + psVar4->num_free_blocks;
            _add_bmp_idx(bmp_idx,uVar6,(bid_t)local_70);
          }
          free(local_70);
          psVar4->min_live_hdr_revnum = uVar6;
          psVar4->min_live_hdr_bid = (bid_t)bmp_idx;
          uVar6 = atomic_get_uint64_t((atomic<unsigned_long> *)local_60,
                                      (memory_order)(local_68 >> 0x20));
          psVar4->bmp_revnum = uVar6 + 1;
          psVar1->rsv_bmp = psVar4;
        }
        local_1 = true;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool sb_reserve_next_reusable_blocks(fdb_kvs_handle *handle)
{
    size_t i;
    uint64_t num_blocks, bmp_size_byte;
    stale_header_info sheader;
    reusable_block_list blist;
    struct superblock *sb = handle->file->sb;
    struct sb_rsv_bmp *rsv = NULL;

    if (sb->rsv_bmp) {
        // next bitmap already reclaimed
        return false;
    }

    sheader = fdb_get_smallest_active_header(handle);
    if (sheader.bid == BLK_NOT_FOUND) {
        return false;
    }

    // get reusable block list
    blist = fdb_get_reusable_block(handle, sheader);
    if (blist.n_blocks == 0) {
        return false;
    }

    // calculate bitmap size
    num_blocks = filemgr_get_pos(handle->file) / handle->file->blocksize;
    bmp_size_byte = (num_blocks+7) / 8;
    if (num_blocks) {
        rsv = (struct sb_rsv_bmp*)calloc(1, sizeof(struct sb_rsv_bmp));
        rsv->bmp = (uint8_t*)calloc(1, bmp_size_byte);
        rsv->cur_alloc_bid = BLK_NOT_FOUND;

        // the initial status is 'INITIALIZING' so that 'rsv_bmp' is not
        // available until executing sb_rsv_append_doc().
        atomic_init_uint32_t(&rsv->status, SB_RSV_INITIALIZING);
        avl_init(&rsv->bmp_idx, NULL);
        rsv->bmp_size = num_blocks;

        for (i=0; i<blist.n_blocks; ++i) {
            sb_bmp_set(rsv->bmp, blist.blocks[i].bid, blist.blocks[i].count);
            if (i==0 && rsv->cur_alloc_bid == BLK_NOT_FOUND) {
                rsv->cur_alloc_bid = blist.blocks[i].bid;
            }
            rsv->num_free_blocks += blist.blocks[i].count;
            _add_bmp_idx(&rsv->bmp_idx, blist.blocks[i].bid, blist.blocks[i].count);
        }
        free(blist.blocks);

        rsv->min_live_hdr_revnum = sheader.revnum;
        rsv->min_live_hdr_bid = sheader.bid;
        rsv->bmp_revnum = atomic_get_uint64_t(&sb->bmp_revnum)+1;
        sb->rsv_bmp = rsv;
    }

    return true;
}